

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void InterpolateRow_AVX2(uint8_t *dst_ptr,uint8_t *src_ptr,ptrdiff_t src_stride,int dst_width,
                        int source_y_fraction)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  uint uVar3;
  undefined4 in_register_0000000c;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int dst_width_local;
  int iVar4;
  
  uVar5 = CONCAT44(in_register_0000000c,dst_width);
  if (source_y_fraction == 0) {
    for (; uVar5 != 0; uVar5 = uVar5 - 1) {
      *dst_ptr = *src_ptr;
      src_ptr = src_ptr + 1;
      dst_ptr = dst_ptr + 1;
    }
  }
  else {
    lVar6 = (long)dst_ptr - (long)src_ptr;
    if (source_y_fraction == 0x80) {
      do {
        auVar9 = vpavgb_avx2(*(undefined1 (*) [32])src_ptr,
                             *(undefined1 (*) [32])(*(undefined1 (*) [32])src_ptr + src_stride));
        *(undefined1 (*) [32])((long)src_ptr + lVar6) = auVar9;
        src_ptr = (uint8_t *)((long)src_ptr + 0x20);
        iVar4 = (int)uVar5;
        uVar3 = iVar4 - 0x20;
        uVar5 = (ulong)uVar3;
      } while (uVar3 != 0 && 0x1f < iVar4);
    }
    else {
      auVar1 = vpunpcklbw_avx(ZEXT416(0x100 - source_y_fraction),ZEXT416((uint)source_y_fraction));
      auVar1 = vpunpcklwd_avx(auVar1,auVar1);
      auVar10._0_4_ = auVar1._0_4_;
      auVar10._4_4_ = auVar10._0_4_;
      auVar10._8_4_ = auVar10._0_4_;
      auVar10._12_4_ = auVar10._0_4_;
      auVar10._16_4_ = auVar10._0_4_;
      auVar10._20_4_ = auVar10._0_4_;
      auVar10._24_4_ = auVar10._0_4_;
      auVar10._28_4_ = auVar10._0_4_;
      auVar9._8_4_ = 0x80808080;
      auVar9._0_8_ = 0x8080808080808080;
      auVar9._12_4_ = 0x80808080;
      auVar9._16_4_ = 0x80808080;
      auVar9._20_4_ = 0x80808080;
      auVar9._24_4_ = 0x80808080;
      auVar9._28_4_ = 0x80808080;
      do {
        auVar7 = vpunpckhbw_avx2(*(undefined1 (*) [32])src_ptr,
                                 *(undefined1 (*) [32])(*(undefined1 (*) [32])src_ptr + src_stride))
        ;
        auVar2 = vpunpcklbw_avx2(*(undefined1 (*) [32])src_ptr,
                                 *(undefined1 (*) [32])(*(undefined1 (*) [32])src_ptr + src_stride))
        ;
        auVar7 = vpsubb_avx2(auVar7,auVar9);
        auVar2 = vpsubb_avx2(auVar2,auVar9);
        auVar7 = vpmaddubsw_avx2(auVar10,auVar7);
        auVar2 = vpmaddubsw_avx2(auVar10,auVar2);
        auVar7 = vpaddw_avx2(auVar7,auVar9);
        auVar2 = vpaddw_avx2(auVar2,auVar9);
        auVar8 = vpsrlw_avx2(auVar7,8);
        auVar7 = vpsrlw_avx2(auVar2,8);
        auVar7 = vpackuswb_avx2(auVar7,auVar8);
        *(undefined1 (*) [32])((long)src_ptr + lVar6) = auVar7;
        src_ptr = (uint8_t *)((long)src_ptr + 0x20);
        iVar4 = (int)uVar5;
        uVar3 = iVar4 - 0x20;
        uVar5 = (ulong)uVar3;
      } while (uVar3 != 0 && 0x1f < iVar4);
    }
  }
  return;
}

Assistant:

void InterpolateRow_AVX2(uint8_t* dst_ptr,
                         const uint8_t* src_ptr,
                         ptrdiff_t src_stride,
                         int dst_width,
                         int source_y_fraction) {
  asm volatile(
      "cmp         $0x0,%3                       \n"
      "je          100f                          \n"
      "sub         %1,%0                         \n"
      "cmp         $0x80,%3                      \n"
      "je          50f                           \n"

      "vmovd       %3,%%xmm0                     \n"
      "neg         %3                            \n"
      "add         $0x100,%3                     \n"
      "vmovd       %3,%%xmm5                     \n"
      "vpunpcklbw  %%xmm0,%%xmm5,%%xmm5          \n"
      "vpunpcklwd  %%xmm5,%%xmm5,%%xmm5          \n"
      "vbroadcastss %%xmm5,%%ymm5                \n"
      "mov         $0x80808080,%%eax             \n"
      "vmovd       %%eax,%%xmm4                  \n"
      "vbroadcastss %%xmm4,%%ymm4                \n"

      // General purpose row blend.
      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%1),%%ymm0                   \n"
      "vmovdqu     0x00(%1,%4,1),%%ymm2          \n"
      "vpunpckhbw  %%ymm2,%%ymm0,%%ymm1          \n"
      "vpunpcklbw  %%ymm2,%%ymm0,%%ymm0          \n"
      "vpsubb      %%ymm4,%%ymm1,%%ymm1          \n"
      "vpsubb      %%ymm4,%%ymm0,%%ymm0          \n"
      "vpmaddubsw  %%ymm1,%%ymm5,%%ymm1          \n"
      "vpmaddubsw  %%ymm0,%%ymm5,%%ymm0          \n"
      "vpaddw      %%ymm4,%%ymm1,%%ymm1          \n"
      "vpaddw      %%ymm4,%%ymm0,%%ymm0          \n"
      "vpsrlw      $0x8,%%ymm1,%%ymm1            \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vmovdqu     %%ymm0,0x00(%1,%0,1)          \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "jmp         99f                           \n"

      // Blend 50 / 50.
      LABELALIGN
      "50:                                       \n"
      "vmovdqu     (%1),%%ymm0                   \n"
      "vpavgb      0x00(%1,%4,1),%%ymm0,%%ymm0   \n"
      "vmovdqu     %%ymm0,0x00(%1,%0,1)          \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          50b                           \n"
      "jmp         99f                           \n"

      // Blend 100 / 0 - Copy row unchanged.
      LABELALIGN
      "100:                                      \n"
      "rep         movsb                         \n"
      "jmp         999f                          \n"

      "99:                                       \n"
      "vzeroupper                                \n"
      "999:                                      \n"
      : "+D"(dst_ptr),               // %0
        "+S"(src_ptr),               // %1
        "+cm"(dst_width),            // %2
        "+r"(source_y_fraction)      // %3
      : "r"((intptr_t)(src_stride))  // %4
      : "memory", "cc", "eax", "xmm0", "xmm1", "xmm2", "xmm4", "xmm5");
}